

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::SWAP<std::complex<double>_>::matrix(SWAP<std::complex<double>_> *this)

{
  complex<double> m02;
  complex<double> m03;
  complex<double> m10;
  complex<double> m11;
  complex<double> m12;
  complex<double> m13;
  complex<double> m20;
  complex<double> m21;
  complex<double> m22;
  complex<double> m23;
  complex<double> m30;
  complex<double> m31;
  complex<double> m32;
  complex<double> m33;
  data_type extraout_RDX;
  SquareMatrix<std::complex<double>_> SVar1;
  complex<double> m00;
  complex<double> m01;
  undefined8 in_stack_fffffffffffffea8;
  SWAP<std::complex<double>_> *pSVar2;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 local_138;
  complex<double> local_130;
  complex<double> local_120;
  complex<double> local_110;
  complex<double> local_100;
  complex<double> local_f0;
  complex<double> local_e0;
  complex<double> local_d0;
  complex<double> local_c0;
  complex<double> local_b0;
  complex<double> local_a0;
  complex<double> local_90;
  complex<double> local_80;
  complex<double> local_70;
  complex<double> local_60;
  complex<double> local_50;
  SWAP<std::complex<double>_> *this_local;
  
  pSVar2 = this;
  this_local = this;
  std::complex<double>::complex(&local_50,1.0,0.0);
  std::complex<double>::complex(&local_60,0.0,0.0);
  std::complex<double>::complex(&local_70,0.0,0.0);
  std::complex<double>::complex(&local_80,0.0,0.0);
  std::complex<double>::complex(&local_90,0.0,0.0);
  std::complex<double>::complex(&local_a0,0.0,0.0);
  std::complex<double>::complex(&local_b0,1.0,0.0);
  std::complex<double>::complex(&local_c0,0.0,0.0);
  std::complex<double>::complex(&local_d0,0.0,0.0);
  std::complex<double>::complex(&local_e0,1.0,0.0);
  std::complex<double>::complex(&local_f0,0.0,0.0);
  std::complex<double>::complex(&local_100,0.0,0.0);
  std::complex<double>::complex(&local_110,0.0,0.0);
  std::complex<double>::complex(&local_120,0.0,0.0);
  std::complex<double>::complex(&local_130,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&stack0xfffffffffffffec0,1.0,0.0);
  m02._M_value._8_8_ = local_90._M_value._8_8_;
  m02._M_value._0_8_ = local_90._M_value._0_8_;
  m03._M_value._8_8_ = local_a0._M_value._8_8_;
  m03._M_value._0_8_ = local_a0._M_value._0_8_;
  m10._M_value._8_8_ = local_b0._M_value._8_8_;
  m10._M_value._0_8_ = local_b0._M_value._0_8_;
  m11._M_value._8_8_ = local_c0._M_value._8_8_;
  m11._M_value._0_8_ = local_c0._M_value._0_8_;
  m12._M_value._8_8_ = local_d0._M_value._8_8_;
  m12._M_value._0_8_ = local_d0._M_value._0_8_;
  m13._M_value._8_8_ = local_e0._M_value._8_8_;
  m13._M_value._0_8_ = local_e0._M_value._0_8_;
  m20._M_value._8_8_ = local_f0._M_value._8_8_;
  m20._M_value._0_8_ = local_f0._M_value._0_8_;
  m21._M_value._8_8_ = local_100._M_value._8_8_;
  m21._M_value._0_8_ = local_100._M_value._0_8_;
  m22._M_value._8_8_ = local_110._M_value._8_8_;
  m22._M_value._0_8_ = local_110._M_value._0_8_;
  m23._M_value._8_8_ = local_120._M_value._8_8_;
  m23._M_value._0_8_ = local_120._M_value._0_8_;
  m30._M_value._8_8_ = local_130._M_value._8_8_;
  m30._M_value._0_8_ = local_130._M_value._0_8_;
  m31._M_value._8_8_ = local_138;
  m31._M_value._0_8_ = in_stack_fffffffffffffec0;
  m32._M_value._8_8_ = this;
  m32._M_value._0_8_ = in_stack_fffffffffffffea8;
  m33._M_value._8_8_ = in_stack_fffffffffffffec0;
  m33._M_value._0_8_ = pSVar2;
  m00._M_value._8_8_ = local_130._M_value._0_8_;
  m00._M_value._0_8_ = local_120._M_value._0_8_;
  m01._M_value._8_8_ = local_110._M_value._0_8_;
  m01._M_value._0_8_ = in_stack_fffffffffffffec0;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)this,m00,m01,m02,m03,m10,m11,m12,m13,m20,m21,m22
             ,m23,m30,m31,m32,m33);
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)pSVar2;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , 1 , 0 ,
                                                  0 , 1 , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
        }